

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat3 * dja::mat3::lookat(vec3 *target,vec3 *origin,vec3 *up)

{
  mat3 *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar2 = origin->x - target->x;
  fVar1 = origin->y - target->y;
  fVar4 = origin->z - target->z;
  fVar3 = 1.0 / SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar1 * fVar1);
  fVar2 = fVar2 * fVar3;
  fVar1 = fVar1 * fVar3;
  fVar3 = fVar3 * fVar4;
  fVar4 = up->y * fVar3 - fVar1 * up->z;
  fVar5 = up->z * fVar2 - fVar3 * up->x;
  fVar7 = up->x * fVar1 - fVar2 * up->y;
  fVar6 = 1.0 / SQRT(fVar7 * fVar7 + fVar4 * fVar4 + fVar5 * fVar5);
  fVar4 = fVar4 * fVar6;
  fVar5 = fVar5 * fVar6;
  fVar6 = fVar6 * fVar7;
  fVar7 = fVar1 * fVar6 - fVar5 * fVar3;
  fVar8 = fVar3 * fVar4 - fVar6 * fVar2;
  in_RDI->m[0].x = fVar2;
  in_RDI->m[0].y = fVar4;
  fVar4 = fVar2 * fVar5 - fVar4 * fVar1;
  fVar2 = 1.0 / SQRT(fVar4 * fVar4 + fVar7 * fVar7 + fVar8 * fVar8);
  in_RDI->m[0].z = fVar7 * fVar2;
  in_RDI->m[1].x = fVar1;
  in_RDI->m[1].y = fVar5;
  in_RDI->m[1].z = fVar8 * fVar2;
  in_RDI->m[2].x = fVar3;
  in_RDI->m[2].y = fVar6;
  in_RDI->m[2].z = fVar2 * fVar4;
  return in_RDI;
}

Assistant:

mat3
mat3::lookat(const vec3 &target, const vec3 &origin, const vec3 &up)
{
    vec3 x = normalize(origin - target);
    vec3 y = normalize(cross(up, x));
    vec3 z = normalize(cross(x, y));

    return transpose(mat3(x, y, z));
}